

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall
memory::
Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
::
Array<memory::Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>&,void>
          (Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
           *this,Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                 *other)

{
  HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_> local_31;
  view_type local_30;
  
  HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>::allocate
            (&local_30,&local_31,
             (other->super_ArrayView<float,_memory::HostCoordinator<float>_>).size_);
  *(pointer *)(this + 8) = local_30.pointer_;
  *(size_type *)(this + 0x10) = local_30.size_;
  HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>::
  copy<memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>
            ((HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>> *)
             (this + 0x18),&other->super_ArrayView<float,_memory::HostCoordinator<float>_>,
             (ArrayView<value_type,_HostCoordinator<value_type,_Allocator<float,_AlignedPolicy<8UL>_>_>_>
              *)this);
  return;
}

Assistant:

Array(Other&& other)
        : base(coordinator_type().allocate(other.size()))
    {
        coordinator_.copy(other, *this);
    }